

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::evalTextureCubeArray(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 local_28 [8];
  float fStack_20;
  float fStack_1c;
  
  tcu::TextureCubeArrayView::sample
            ((TextureCubeArrayView *)local_28,(Sampler *)&(c->textures[0].texCubeArray)->m_view,
             c->in[0].m_data[0],c->in[0].m_data[1],c->in[0].m_data[2],c->in[0].m_data[3],p->lod);
  fVar1 = (p->scale).m_data[1];
  fVar2 = (p->scale).m_data[2];
  fVar3 = (p->scale).m_data[3];
  fVar4 = (p->bias).m_data[1];
  fVar5 = (p->bias).m_data[2];
  fVar6 = (p->bias).m_data[3];
  (c->color).m_data[0] = (p->scale).m_data[0] * (float)local_28._0_4_ + (p->bias).m_data[0];
  (c->color).m_data[1] = fVar1 * (float)local_28._4_4_ + fVar4;
  (c->color).m_data[2] = fVar2 * fStack_20 + fVar5;
  (c->color).m_data[3] = fVar3 * fStack_1c + fVar6;
  return;
}

Assistant:

static void		evalTextureCubeArray	(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = textureCubeArray(c, c.in[0].x(), c.in[0].y(), c.in[0].z(), c.in[0].w(), p.lod)*p.scale + p.bias; }